

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<16U,_12U,_buffer_layout_dfs>::operator()
          (fill<16U,_12U,_buffer_layout_dfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  size_t sVar1;
  uchar *puVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  uchar **ppuVar6;
  long lVar7;
  ulong n0;
  uchar *puVar8;
  uchar **ppuVar9;
  size_t sVar10;
  uchar **ppuVar11;
  DI __d;
  size_t local_58;
  size_t local_40;
  DI local_38;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fill_leaf",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", leaf,  I=",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  if (buffer_count->_M_elems[0xc] != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 16U, I = 12U, BufferLayout = buffer_layout_dfs]"
                 );
  }
  sVar10 = streams->_M_elems[8].n;
  sVar1 = streams->_M_elems[9].n;
  n0 = sVar1 + sVar10;
  if (n0 < 8) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"need=",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ln=",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    lVar7 = -n0;
    if (streams->_M_elems[8].n == 0) {
      lVar5 = 8;
LAB_0019c392:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"left drained, Ln=",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      sVar10 = streams->_M_elems[9].n;
      if (sVar10 != 0) {
        memcpy(buffer + lVar7 + (0x100 - lVar5),streams->_M_elems[9].stream,sVar10 << 3);
      }
      streams->_M_elems[9].n = 0;
      buffer_count->_M_elems[0xc] = n0;
    }
    else {
      if (streams->_M_elems[9].n != 0) {
        ppuVar6 = streams->_M_elems[8].stream;
        puVar8 = *ppuVar6;
        if (puVar8 != (uchar *)0x0) {
          local_58 = streams->_M_elems[8].n;
          ppuVar9 = streams->_M_elems[9].stream;
          local_40 = streams->_M_elems[9].n;
          ppuVar11 = buffer + lVar7 + 0xf8;
          lVar5 = 7;
          do {
            puVar2 = *ppuVar9;
            if (puVar2 == (uchar *)0x0) goto LAB_0019c636;
            iVar3 = strcmp((char *)puVar8,(char *)puVar2);
            if (iVar3 < 1) {
              *ppuVar11 = puVar8;
              ppuVar6 = ppuVar6 + 1;
              streams->_M_elems[8].stream = ppuVar6;
              local_58 = local_58 - 1;
              streams->_M_elems[8].n = local_58;
              if (local_58 == 0) goto LAB_0019c392;
            }
            else {
              *ppuVar11 = puVar2;
              ppuVar9 = ppuVar9 + 1;
              streams->_M_elems[9].stream = ppuVar9;
              local_40 = local_40 - 1;
              streams->_M_elems[9].n = local_40;
              if (local_40 == 0) goto LAB_0019c2a8;
            }
            puVar8 = *ppuVar6;
            ppuVar11 = ppuVar11 + 1;
            lVar5 = lVar5 + -1;
          } while (puVar8 != (uchar *)0x0);
        }
LAB_0019c0d7:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      lVar5 = 8;
LAB_0019c2a8:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"right drained, Ln=",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      sVar10 = streams->_M_elems[8].n;
      if (sVar10 != 0) {
        memcpy(buffer + lVar7 + 0xf8 + (8 - lVar5),streams->_M_elems[8].stream,sVar10 << 3);
      }
      streams->_M_elems[8].n = 0;
      buffer_count->_M_elems[0xc] = n0;
      check_input(buffer + lVar7 + 0xf8,n0);
    }
    goto LAB_0019c61d;
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"need=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ln=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (sVar10 == 0) {
    lVar7 = 8;
LAB_0019c540:
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"left drained, Ln=",0x11);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
    sVar10 = streams->_M_elems[9].n;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    ppuVar6 = streams->_M_elems[9].stream;
    if (lVar7 != 0) {
      memcpy(buffer + (0xf8 - lVar7),ppuVar6,lVar7 * 8);
    }
    streams->_M_elems[9].n = sVar10 - lVar7;
    streams->_M_elems[9].stream = ppuVar6 + lVar7;
LAB_0019c5ff:
    buffer_count->_M_elems[0xc] = 8;
  }
  else {
    if (sVar1 == 0) {
      lVar7 = 8;
LAB_0019c46a:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"right drained, Ln=",0x12);
      sVar10 = streams->_M_elems[8].n;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Rn=",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      ppuVar6 = streams->_M_elems[8].stream;
      if (lVar7 != 0) {
        memcpy(buffer + (0xf8 - lVar7),ppuVar6,lVar7 * 8);
      }
      streams->_M_elems[8].n = sVar10 - lVar7;
      streams->_M_elems[8].stream = ppuVar6 + lVar7;
      goto LAB_0019c5ff;
    }
    ppuVar6 = streams->_M_elems[8].stream;
    local_58 = streams->_M_elems[8].n;
    ppuVar9 = streams->_M_elems[9].stream;
    sVar10 = streams->_M_elems[9].n;
    lVar7 = 0;
    do {
      puVar8 = *ppuVar6;
      if (puVar8 == (uchar *)0x0) goto LAB_0019c0d7;
      puVar2 = *ppuVar9;
      if (puVar2 == (uchar *)0x0) {
LAB_0019c636:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar3 = strcmp((char *)puVar8,(char *)puVar2);
      if (iVar3 < 1) {
        buffer[lVar7 + 0xf0] = puVar8;
        ppuVar6 = ppuVar6 + 1;
        streams->_M_elems[8].stream = ppuVar6;
        local_58 = local_58 - 1;
        streams->_M_elems[8].n = local_58;
        if (local_58 == 0) {
          lVar7 = 7 - lVar7;
          goto LAB_0019c540;
        }
      }
      else {
        buffer[lVar7 + 0xf0] = puVar2;
        ppuVar9 = ppuVar9 + 1;
        streams->_M_elems[9].stream = ppuVar9;
        sVar10 = sVar10 - 1;
        streams->_M_elems[9].n = sVar10;
        if (sVar10 == 0) {
          lVar7 = 7 - lVar7;
          goto LAB_0019c46a;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    buffer_count->_M_elems[0xc] = 8;
  }
  check_input(buffer + 0xf0,8);
LAB_0019c61d:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}